

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

int8_t av1_ref_frame_type(MV_REFERENCE_FRAME *rf)

{
  int8_t iVar1;
  char cVar2;
  char *in_RDI;
  int8_t uni_comp_ref_idx;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_RDI[1] < '\x01') {
    cVar2 = *in_RDI;
  }
  else {
    iVar1 = get_uni_comp_ref_idx
                      ((MV_REFERENCE_FRAME *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (iVar1 < '\0') {
      cVar2 = *in_RDI + '\a' + (in_RDI[1] + -5) * '\x04';
    }
    else {
      cVar2 = iVar1 + '\x14';
    }
  }
  return cVar2;
}

Assistant:

static inline int8_t av1_ref_frame_type(const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] > INTRA_FRAME) {
    const int8_t uni_comp_ref_idx = get_uni_comp_ref_idx(rf);
    if (uni_comp_ref_idx >= 0) {
      assert((REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx) <
             MODE_CTX_REF_FRAMES);
      return REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx;
    } else {
      return REF_FRAMES + FWD_RF_OFFSET(rf[0]) +
             BWD_RF_OFFSET(rf[1]) * FWD_REFS;
    }
  }

  return rf[0];
}